

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NgammaT.cpp
# Opt level: O0

void __thiscall OpenMD::NgammaT::evolveEtaA(NgammaT *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  SquareMatrix3<double> *pSVar13;
  long in_RDI;
  SquareMatrix3<double> *this_00;
  RealType sy;
  RealType sx;
  RealType Axy;
  RealType hz;
  Mat3x3d hmat;
  Snapshot *in_stack_ffffffffffffff08;
  RectMatrix<double,_3U,_3U> local_50;
  
  Snapshot::getHmat(in_stack_ffffffffffffff08);
  pdVar12 = RectMatrix<double,_3U,_3U>::operator()
                      (&local_50,*(uint *)(in_RDI + 0x330),*(uint *)(in_RDI + 0x330));
  dVar1 = *pdVar12;
  pdVar12 = RectMatrix<double,_3U,_3U>::operator()
                      (&local_50,*(uint *)(in_RDI + 0x334),*(uint *)(in_RDI + 0x334));
  dVar2 = *pdVar12;
  pdVar12 = RectMatrix<double,_3U,_3U>::operator()
                      (&local_50,*(uint *)(in_RDI + 0x338),*(uint *)(in_RDI + 0x338));
  dVar3 = *pdVar12;
  pdVar12 = RectMatrix<double,_3U,_3U>::operator()
                      ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x1b0),*(uint *)(in_RDI + 0x334),
                       *(uint *)(in_RDI + 0x334));
  dVar4 = *pdVar12;
  dVar5 = *(double *)(in_RDI + 0x138);
  pdVar12 = RectMatrix<double,_3U,_3U>::operator()
                      ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x1b0),*(uint *)(in_RDI + 0x338),
                       *(uint *)(in_RDI + 0x338));
  dVar6 = *pdVar12;
  dVar7 = *(double *)(in_RDI + 0x138);
  dVar8 = *(double *)(in_RDI + 0x10);
  dVar9 = *(double *)(in_RDI + 0xf8);
  dVar10 = *(double *)(in_RDI + 0x328);
  dVar11 = *(double *)(in_RDI + 0x110);
  pdVar12 = RectMatrix<double,_3U,_3U>::operator()
                      ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),*(uint *)(in_RDI + 0x334),
                       *(uint *)(in_RDI + 0x334));
  *pdVar12 = *pdVar12 -
             (dVar8 * dVar2 * dVar3 * (-dVar1 * (dVar4 + dVar5 / -163882576.0) - dVar10)) /
             (dVar9 * dVar11);
  this_00 = (SquareMatrix3<double> *)
            ((*(double *)(in_RDI + 0x10) * dVar2 * dVar3 *
             (-dVar1 * (dVar6 + dVar7 / -163882576.0) - *(double *)(in_RDI + 0x328))) /
            (*(double *)(in_RDI + 0xf8) * *(double *)(in_RDI + 0x110)));
  pdVar12 = RectMatrix<double,_3U,_3U>::operator()
                      ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),*(uint *)(in_RDI + 0x338),
                       *(uint *)(in_RDI + 0x338));
  *pdVar12 = *pdVar12 - (double)this_00;
  pSVar13 = (SquareMatrix3<double> *)
            RectMatrix<double,_3U,_3U>::operator()
                      ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),*(uint *)(in_RDI + 0x330),
                       *(uint *)(in_RDI + 0x330));
  (pSVar13->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  SquareMatrix3<double>::operator=(this_00,pSVar13);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x20fe0b);
  return;
}

Assistant:

void NgammaT::evolveEtaA() {
    Mat3x3d hmat = snap->getHmat();
    RealType hz  = hmat(axis_, axis_);
    RealType Axy = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);
    RealType sx  = -hz * (press(axis1_, axis1_) -
                         targetPressure / Constants::pressureConvert);
    RealType sy  = -hz * (press(axis2_, axis2_) -
                         targetPressure / Constants::pressureConvert);
    eta(axis1_, axis1_) -= dt2 * Axy * (sx - surfaceTension_) / (NkBT * tb2);
    eta(axis2_, axis2_) -= dt2 * Axy * (sy - surfaceTension_) / (NkBT * tb2);
    eta(axis_, axis_) = 0.0;
    oldEta_           = eta;
  }